

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

bool __thiscall ON_OBSOLETE_V5_Leader::Transform(ON_OBSOLETE_V5_Leader *this,ON_Xform *xform)

{
  uint c;
  ON_2dPoint *pOVar1;
  ON_3dPoint p;
  bool bVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ON_Plane *this_00;
  ON_Plane *pOVar6;
  ON_Plane *pOVar7;
  ulong uVar8;
  bool bVar9;
  byte bVar10;
  ON_2dVector OVar11;
  ON_2dPoint q2;
  ON_2dPointArray q;
  ON_3dPoint P;
  ON_Plane plane;
  ON_2dVector local_168;
  ulong local_158;
  ON_Xform *local_150;
  ON_Plane *local_148;
  ON_OBSOLETE_V5_Leader *local_140;
  ON_2dPoint local_138;
  ON_3dPoint local_128;
  double local_110;
  double local_108;
  ON_SimpleArray<ON_2dPoint> local_100;
  double local_e8;
  double dStack_e0;
  double local_d8;
  ON_3dPoint local_c8;
  ON_Plane local_b0;
  
  bVar10 = 0;
  bVar2 = ON_Xform::IsIdentity(xform,0.0);
  if (bVar2) {
    return true;
  }
  this_00 = &(this->super_ON_OBSOLETE_V5_Annotation).m_plane;
  pOVar6 = this_00;
  pOVar7 = &local_b0;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pOVar7->origin).x = (pOVar6->origin).x;
    pOVar6 = (ON_Plane *)((long)pOVar6 + (ulong)bVar10 * -0x10 + 8);
    pOVar7 = (ON_Plane *)((long)pOVar7 + (ulong)bVar10 * -0x10 + 8);
  }
  bVar2 = ON_Plane::Transform(&local_b0,xform);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_004a3a42;
  }
  c = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count;
  uVar8 = (ulong)c;
  ON_2dPointArray::ON_2dPointArray((ON_2dPointArray *)&local_100,c);
  if ((int)c < 1) {
    bVar2 = false;
LAB_004a3929:
    ON_Geometry::Transform((ON_Geometry *)this,xform);
    pOVar6 = &local_b0;
    pOVar7 = this_00;
    for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pOVar7->origin).x = (pOVar6->origin).x;
      pOVar6 = (ON_Plane *)((long)pOVar6 + ((ulong)bVar10 * -2 + 1) * 8);
      pOVar7 = (ON_Plane *)((long)pOVar7 + (ulong)bVar10 * -0x10 + 8);
    }
    if (bVar2) {
      ON_2dPointArray::operator=
                (&(this->super_ON_OBSOLETE_V5_Annotation).m_points,(ON_2dPointArray *)&local_100);
    }
    pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
    if ((((pOVar1->x != 0.0) || (NAN(pOVar1->x))) || (pOVar1->y != 0.0)) || (NAN(pOVar1->y))) {
      ON_2dVector::ON_2dVector(&local_168,pOVar1);
      bVar2 = ON_2dVector::IsZero(&local_168);
      if (!bVar2) {
        ON_Plane::PointAt(&local_128,this_00,local_168.x,local_168.y);
        (this_00->origin).z = local_128.z;
        (this_00->origin).x = local_128.x;
        (this_00->origin).y = local_128.y;
        ON_Plane::UpdateEquation(this_00);
        OVar11 = ON_2dVector::operator-(&local_168);
        local_168.y = OVar11.y;
        local_168.x = OVar11.x;
        if (1 < (int)uVar8) {
          lVar4 = 0x10;
          do {
            ON_2dPoint::operator+=
                      ((ON_2dPoint *)
                       ((long)&((this->super_ON_OBSOLETE_V5_Annotation).m_points.
                                super_ON_SimpleArray<ON_2dPoint>.m_a)->x + lVar4),&local_168);
            lVar4 = lVar4 + 0x10;
          } while (uVar8 * 0x10 != lVar4);
        }
        ON_2dPoint::Set((this->super_ON_OBSOLETE_V5_Annotation).m_points.
                        super_ON_SimpleArray<ON_2dPoint>.m_a,0.0,0.0);
      }
    }
    bVar2 = true;
  }
  else {
    lVar4 = 8;
    uVar5 = 1;
    bVar2 = false;
    local_158 = uVar8;
    local_150 = xform;
    local_148 = this_00;
    local_140 = this;
    do {
      pOVar1 = (local_140->super_ON_OBSOLETE_V5_Annotation).m_points.
               super_ON_SimpleArray<ON_2dPoint>.m_a;
      local_110 = *(double *)((long)pOVar1 + lVar4 + -8);
      local_108 = *(double *)((long)&pOVar1->x + lVar4);
      ON_Plane::PointAt(&local_128,local_148,local_110,local_108);
      local_c8.z = local_128.z;
      local_c8.x = local_128.x;
      local_c8.y = local_128.y;
      ON_Xform::operator*(&local_128,local_150,&local_c8);
      local_d8 = local_128.z;
      local_e8 = local_128.x;
      dStack_e0 = local_128.y;
      p.y = local_128.y;
      p.x = local_128.x;
      p.z = local_128.z;
      bVar3 = ON_Plane::ClosestPointTo(&local_b0,p,&local_138.x,&local_138.y);
      bVar9 = true;
      if (ABS(local_110 - local_138.x) <= 1.490116119385e-08) {
        local_138.x = local_110;
        bVar9 = bVar2;
      }
      bVar2 = true;
      if (ABS(local_108 - local_138.y) <= 1.490116119385e-08) {
        local_138.y = local_108;
        bVar2 = bVar9;
      }
      ON_SimpleArray<ON_2dPoint>::Append(&local_100,&local_138);
      bVar9 = uVar5 < local_158;
      lVar4 = lVar4 + 0x10;
      uVar5 = uVar5 + 1;
    } while (bVar9 && bVar3);
    this_00 = local_148;
    uVar8 = local_158;
    xform = local_150;
    this = local_140;
    if (bVar3) goto LAB_004a3929;
    bVar2 = false;
  }
  ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&local_100);
LAB_004a3a42:
  ON_Plane::~ON_Plane(&local_b0);
  return bVar2;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::Transform( const ON_Xform& xform )
{
  bool rc = xform.IsIdentity();
  if ( !rc)
  {
    ON_Plane plane = m_plane;
    rc = plane.Transform(xform);
    if ( rc )
    {
      int i;
      const int point_count =  m_points.Count();
      ON_2dPointArray q(point_count);
      ON_2dPoint p2, q2;
      ON_3dPoint P, Q;
      bool bUpdatePoints = false;
      for ( i = 0; i < point_count && rc; i++ )
      {
        p2 = m_points[i];
        P = m_plane.PointAt( p2.x, p2.y );
        Q = xform*P;
        if( !plane.ClosestPointTo(Q,&q2.x,&q2.y) )
          rc = false;
        if ( fabs(p2.x - q2.x) <= ON_SQRT_EPSILON )
          q2.x = p2.x;
        else
          bUpdatePoints = true;
        if ( fabs(p2.y - q2.y) <= ON_SQRT_EPSILON )
          q2.y = p2.y;
        else
          bUpdatePoints = true;
        q.Append(q2);
      }

      if(rc)
      {
        ON_Geometry::Transform(xform);
        m_plane = plane;

        if ( bUpdatePoints )
          m_points = q;

        if ( m_points[0].x != 0.0 || m_points[0].y != 0.0 )
        {
          ON_2dVector v = m_points[0];
          if ( !v.IsZero() )
          {
            m_plane.origin = m_plane.PointAt(v.x,v.y);
            m_plane.UpdateEquation();
            v = -v;
            for ( i = 1; i < point_count; i++ )
            {
              m_points[i] += v;
            }
            m_points[0].Set(0.0,0.0);
          }
        }
      }
    }
  }
  return rc;
}